

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O2

int CVodeGetNumStabLimOrderReds(void *cvode_mem,long *nslred)

{
  long lVar1;
  int iVar2;
  
  if (cvode_mem == (void *)0x0) {
    iVar2 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,0x4c0,"CVodeGetNumStabLimOrderReds",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_io.c"
                   ,"cvode_mem = NULL illegal.");
  }
  else {
    iVar2 = 0;
    if (*(int *)((long)cvode_mem + 0x488) == 0) {
      lVar1 = 0;
    }
    else {
      lVar1 = *(long *)((long)cvode_mem + 0x558);
    }
    *nslred = lVar1;
  }
  return iVar2;
}

Assistant:

int CVodeGetNumStabLimOrderReds(void* cvode_mem, long int* nslred)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_sldeton == SUNFALSE) { *nslred = 0; }
  else { *nslred = cv_mem->cv_nor; }

  return (CV_SUCCESS);
}